

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::Textures::CopyErrorsTest::CopyErrorsTest
          (CopyErrorsTest *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"textures_copy_errors","Texture Copy Errors Test");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02138228;
  this->m_fbo = 0;
  this->m_fbo_ms = 0;
  this->m_fbo_incomplete = 0;
  this->m_to_src = 0;
  this->m_to_src_ms = 0;
  this->m_to_1D_dst = 0;
  this->m_to_2D_dst = 0;
  this->m_to_3D_dst = 0;
  this->m_to_invalid = 0;
  return;
}

Assistant:

CopyErrorsTest::CopyErrorsTest(deqp::Context& context)
	: deqp::TestCase(context, "textures_copy_errors", "Texture Copy Errors Test")
	, m_fbo(0)
	, m_fbo_ms(0)
	, m_fbo_incomplete(0)
	, m_to_src(0)
	, m_to_src_ms(0)
	, m_to_1D_dst(0)
	, m_to_2D_dst(0)
	, m_to_3D_dst(0)
	, m_to_invalid(0)
{
	/* Intentionally left blank. */
}